

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# custom-bounds.cpp
# Opt level: O0

void __thiscall Block::print_data(Block *this,ProxyWithLink *cp)

{
  size_type sVar1;
  Proxy *in_RSI;
  vector<int,_std::allocator<int>_> *in_RDI;
  char (*unaff_retaddr) [9];
  FILE *in_stack_00000008;
  size_t i;
  undefined8 local_20;
  vector<int,_std::allocator<int>_> *args;
  
  args = in_RDI;
  diy::Master::Proxy::gid(in_RSI);
  fmt::v7::print<char[9],int,char>(in_stack_00000008,unaff_retaddr,(int *)args);
  local_20 = 0;
  while( true ) {
    sVar1 = std::vector<int,_std::allocator<int>_>::size(in_RDI);
    if (sVar1 <= local_20) break;
    std::vector<int,_std::allocator<int>_>::operator[](in_RDI,local_20);
    fmt::v7::print<char[4],int&,char>(in_stack_00000008,(char (*) [4])unaff_retaddr,(int *)args);
    local_20 = local_20 + 1;
  }
  fmt::v7::print<char[2],,char>(in_stack_00000008,(char (*) [2])unaff_retaddr);
  return;
}

Assistant:

void print_data(const diy::Master::ProxyWithLink&     cp)
    {
        fmt::print(stderr, "gid {}:\n", cp.gid());
        for (size_t i = 0; i < vals.size(); i++)
            fmt::print(stderr, "{} ", vals[i]);
        fmt::print(stderr, "\n");
    }